

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::DateTest_test_valid_date_to_string_Test::TestBody
          (DateTest_test_valid_date_to_string_Test *this)

{
  bool bVar1;
  Date *this_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  AssertHelper local_b8;
  Message local_b0;
  string local_a8 [32];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Date *date2;
  AssertHelper local_68;
  Message local_60;
  string local_58 [32];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Date *date1;
  DateTest_test_valid_date_to_string_Test *this_local;
  
  this_00 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(this_00,0x7e2,10,10);
  bidfx_public_api::tools::Date::ToString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_38,"date1->ToString().c_str()","\"20181010\"",pcVar2,"20181010");
  std::__cxx11::string::~string(local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (bVar1) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0xc)
    ;
    bidfx_public_api::tools::Date::Date((Date *)this_01,0x7e2,9,5);
    gtest_ar_1.message_.ptr_ = this_01;
    bidfx_public_api::tools::Date::ToString_abi_cxx11_();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_88,"date2->ToString().c_str()","\"20180905\"",pcVar2,"20180905");
    std::__cxx11::string::~string(local_a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/date_test.cpp"
                 ,0x1a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  }
  return;
}

Assistant:

TEST(DateTest, test_valid_date_to_string) {
    Date* date1 = new Date(2018, 10, 10);
    ASSERT_STREQ(date1->ToString().c_str(), "20181010");

    Date* date2 = new Date(2018, 9, 5);
    ASSERT_STREQ(date2->ToString().c_str(), "20180905");
}